

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

void findEventBits(int pi)

{
  int in_EDI;
  int unaff_retaddr;
  uint32_t bits;
  evtCallback_t *ep;
  uint local_14;
  evtCallback_t *peVar1;
  int in_stack_fffffffffffffff8;
  
  local_14 = 0;
  for (peVar1 = geCallBackFirst; peVar1 != (evtCallback_t *)0x0; peVar1 = peVar1->next) {
    if (peVar1->pi == in_EDI) {
      local_14 = 1 << ((byte)peVar1->event & 0x1f) | local_14;
    }
  }
  if (local_14 != gEventBits[in_EDI]) {
    gEventBits[in_EDI] = local_14;
    pigpio_command(unaff_retaddr,in_EDI,in_stack_fffffffffffffff8,0,0);
  }
  return;
}

Assistant:

static void findEventBits(int pi)
{
   evtCallback_t *ep;
   uint32_t bits = 0;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->pi == pi) bits |= (1<<(ep->event));
      ep = ep->next;
   }

   if (bits != gEventBits[pi])
   {
      gEventBits[pi] = bits;
      pigpio_command(pi, PI_CMD_EVM, gPigHandle[pi], gEventBits[pi], 1);
   }
}